

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O3

void init_fare_attributes(fare_attributes_t *record)

{
  record->fare_id[0] = '\0';
  record->price = 0.0;
  record->currency_type[0] = '\0';
  record->payment_method = PM_NOT_SET;
  record->transfers = TS_NOT_SET;
  record->agency_id[0] = '\0';
  record->transfer_duration = 0.0;
  return;
}

Assistant:

void init_fare_attributes(fare_attributes_t *record) {
    strcpy(record->fare_id, "");
    record->price = 0.0;
    strcpy(record->currency_type, "");
    record->payment_method = PM_NOT_SET;
    record->transfers = TS_NOT_SET;
    strcpy(record->agency_id, "");
    record->transfer_duration = 0.0;
}